

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O2

SstStatusValue SstWaitForCompletion(SstStream Stream,void *handle)

{
  int iVar1;
  
  if (Stream->ConfigParams->ReaderShortCircuitReads != 0) {
    return SstSuccess;
  }
  iVar1 = (*Stream->DP_Interface->waitForCompletion)(&Svcs,handle);
  return (uint)(iVar1 != 1) * 2;
}

Assistant:

extern SstStatusValue SstWaitForCompletion(SstStream Stream, void *handle)
{
    if (Stream->ConfigParams->ReaderShortCircuitReads)
        return SstSuccess;
    if (Stream->DP_Interface->waitForCompletion(&Svcs, handle) != 1)
    {
        return SstFatalError;
    }
    else
    {
        return SstSuccess;
    }
}